

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaBlockMetadata_Linear::Alloc
          (VmaBlockMetadata_Linear *this,VmaAllocationRequest *request,VmaSuballocationType type,
          void *userData)

{
  VmaAllocationRequestType VVar1;
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_> *this_00;
  VmaSuballocation newSuballoc;
  VmaSuballocation local_28;
  
  local_28.offset = (VkDeviceSize)(request->allocHandle + -1);
  local_28.size = request->size;
  VVar1 = request->type;
  local_28.userData = userData;
  local_28.type = type;
  if (VVar1 == EndOf2nd) {
    this_00 = &this->m_Suballocations0 + (this->m_1stVectorIndex == 0);
    if (this->m_2ndVectorMode == SECOND_VECTOR_EMPTY) {
      this->m_2ndVectorMode = SECOND_VECTOR_RING_BUFFER;
    }
  }
  else {
    if (VVar1 != EndOf1st) {
      if (VVar1 == UpperAddress) {
        VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::push_back
                  (&this->m_Suballocations0 + (this->m_1stVectorIndex == 0),&local_28);
        this->m_2ndVectorMode = SECOND_VECTOR_DOUBLE_STACK;
      }
      goto LAB_001a3e10;
    }
    this_00 = &this->m_Suballocations0 + (this->m_1stVectorIndex != 0);
  }
  VmaVector<VmaSuballocation,_VmaStlAllocator<VmaSuballocation>_>::push_back(this_00,&local_28);
LAB_001a3e10:
  this->m_SumFreeSize = this->m_SumFreeSize - local_28.size;
  return;
}

Assistant:

void VmaBlockMetadata_Linear::Alloc(
    const VmaAllocationRequest& request,
    VmaSuballocationType type,
    void* userData)
{
    const VkDeviceSize offset = (VkDeviceSize)request.allocHandle - 1;
    const VmaSuballocation newSuballoc = { offset, request.size, userData, type };

    switch (request.type)
    {
    case VmaAllocationRequestType::UpperAddress:
    {
        VMA_ASSERT(m_2ndVectorMode != SECOND_VECTOR_RING_BUFFER &&
            "CRITICAL ERROR: Trying to use linear allocator as double stack while it was already used as ring buffer.");
        SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();
        suballocations2nd.push_back(newSuballoc);
        m_2ndVectorMode = SECOND_VECTOR_DOUBLE_STACK;
    }
    break;
    case VmaAllocationRequestType::EndOf1st:
    {
        SuballocationVectorType& suballocations1st = AccessSuballocations1st();

        VMA_ASSERT(suballocations1st.empty() ||
            offset >= suballocations1st.back().offset + suballocations1st.back().size);
        // Check if it fits before the end of the block.
        VMA_ASSERT(offset + request.size <= GetSize());

        suballocations1st.push_back(newSuballoc);
    }
    break;
    case VmaAllocationRequestType::EndOf2nd:
    {
        SuballocationVectorType& suballocations1st = AccessSuballocations1st();
        // New allocation at the end of 2-part ring buffer, so before first allocation from 1st vector.
        VMA_ASSERT(!suballocations1st.empty() &&
            offset + request.size <= suballocations1st[m_1stNullItemsBeginCount].offset);
        SuballocationVectorType& suballocations2nd = AccessSuballocations2nd();

        switch (m_2ndVectorMode)
        {
        case SECOND_VECTOR_EMPTY:
            // First allocation from second part ring buffer.
            VMA_ASSERT(suballocations2nd.empty());
            m_2ndVectorMode = SECOND_VECTOR_RING_BUFFER;
            break;
        case SECOND_VECTOR_RING_BUFFER:
            // 2-part ring buffer is already started.
            VMA_ASSERT(!suballocations2nd.empty());
            break;
        case SECOND_VECTOR_DOUBLE_STACK:
            VMA_ASSERT(0 && "CRITICAL ERROR: Trying to use linear allocator as ring buffer while it was already used as double stack.");
            break;
        default:
            VMA_ASSERT(0);
        }

        suballocations2nd.push_back(newSuballoc);
    }
    break;
    default:
        VMA_ASSERT(0 && "CRITICAL INTERNAL ERROR.");
    }

    m_SumFreeSize -= newSuballoc.size;
}